

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void luaV_concat(lua_State *L,int total)

{
  size_t __n;
  int iVar1;
  uint uVar2;
  char *str;
  ulong uVar3;
  GCObject *pGVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  StkId pTVar9;
  TValue *p1;
  size_t sVar10;
  StkId pTVar11;
  
  pTVar9 = L->top;
  do {
    uVar2 = 1;
    p1 = pTVar9 + -2;
    uVar6 = 1;
    if ((pTVar9[-2].tt_ == 3 || (pTVar9[-2].tt_ & 0xfU) == 4) &&
       (((pTVar9[-1].tt_ & 0xfU) == 4 || (iVar1 = luaV_tostring(L,pTVar9 + -1), iVar1 != 0)))) {
      sVar10 = *(size_t *)(pTVar9[-1].value_.f + 0x10);
      uVar5 = pTVar9[-2].tt_ & 0xf;
      if (sVar10 == 0) {
        if (uVar5 != 4) {
          luaV_tostring(L,p1);
          uVar6 = uVar2;
        }
      }
      else if ((uVar5 == 4) && (*(long *)((p1->value_).f + 0x10) == 0)) {
        pTVar9[-2].value_.f = pTVar9[-1].value_.f;
        pTVar9[-2].tt_ = pTVar9[-1].tt_;
        uVar6 = uVar2;
      }
      else {
        if (1 < total) {
          uVar2 = total;
        }
        for (uVar7 = 1; (long)uVar7 < (long)total; uVar7 = uVar7 + 1) {
          if (((p1->tt_ & 0xfU) != 4) && (iVar1 = luaV_tostring(L,p1), iVar1 == 0))
          goto LAB_00110a60;
          if (-sVar10 - 3 <= *(ulong *)((p1->value_).f + 0x10)) {
            luaG_runerror(L,"string length overflow");
          }
          sVar10 = sVar10 + *(ulong *)((p1->value_).f + 0x10);
          p1 = p1 + -1;
        }
        uVar7 = (ulong)uVar2;
LAB_00110a60:
        str = luaZ_openspace(L,&L->l_G->buff,sVar10);
        uVar3 = uVar7 & 0xffffffff;
        uVar8 = uVar3 + 1;
        pTVar11 = pTVar9 + -uVar3;
        sVar10 = 0;
        do {
          __n = *(size_t *)((pTVar11->value_).f + 0x10);
          memcpy(str + sVar10,(pTVar11->value_).f + 0x18,__n);
          sVar10 = __n + sVar10;
          uVar8 = uVar8 - 1;
          pTVar11 = pTVar11 + 1;
        } while (1 < uVar8);
        pGVar4 = (GCObject *)luaS_newlstr(L,str,sVar10);
        pTVar9[-uVar3].value_.gc = pGVar4;
        pTVar9[-uVar3].tt_ = (pGVar4->gch).tt | 0x40;
        uVar6 = (int)uVar7 - 1;
      }
    }
    else {
      iVar1 = call_binTM(L,p1,pTVar9 + -1,p1,TM_CONCAT);
      if (iVar1 == 0) {
        luaG_concaterror(L,p1,pTVar9 + -1);
      }
    }
    total = total - uVar6;
    pTVar9 = L->top + -(long)(int)uVar6;
    L->top = pTVar9;
    if (total < 2) {
      return;
    }
  } while( true );
}

Assistant:

void luaV_concat (lua_State *L, int total) {
  lua_assert(total >= 2);
  do {
    StkId top = L->top;
    int n = 2;  /* number of elements handled in this pass (at least 2) */
    if (!(ttisstring(top-2) || ttisnumber(top-2)) || !tostring(L, top-1)) {
      if (!call_binTM(L, top-2, top-1, top-2, TM_CONCAT))
        luaG_concaterror(L, top-2, top-1);
    }
    else if (tsvalue(top-1)->len == 0)  /* second operand is empty? */
      (void)tostring(L, top - 2);  /* result is first operand */
    else if (ttisstring(top-2) && tsvalue(top-2)->len == 0) {
      setobjs2s(L, top - 2, top - 1);  /* result is second op. */
    }
    else {
      /* at least two non-empty string values; get as many as possible */
      size_t tl = tsvalue(top-1)->len;
      char *buffer;
      int i;
      /* collect total length */
      for (i = 1; i < total && tostring(L, top-i-1); i++) {
        size_t l = tsvalue(top-i-1)->len;
        if (l >= (MAX_SIZET/sizeof(char)) - tl)
          luaG_runerror(L, "string length overflow");
        tl += l;
      }
      buffer = luaZ_openspace(L, &G(L)->buff, tl);
      tl = 0;
      n = i;
      do {  /* concat all strings */
        size_t l = tsvalue(top-i)->len;
        memcpy(buffer+tl, svalue(top-i), l * sizeof(char));
        tl += l;
      } while (--i > 0);
      setsvalue2s(L, top-n, luaS_newlstr(L, buffer, tl));
    }
    total -= n-1;  /* got 'n' strings to create 1 new */
    L->top -= n-1;  /* popped 'n' strings and pushed one */
  } while (total > 1);  /* repeat until only 1 result left */
}